

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool CLI::detail::split_windows_style(string *current,string *name,string *value)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  if (1 < current->_M_string_length) {
    pcVar2 = (current->_M_dataplus)._M_p;
    if ((*pcVar2 == '/') && (bVar1 = pcVar2[1], 0x21 < bVar1 && bVar1 != 0x2d)) {
      lVar4 = ::std::__cxx11::string::find((char)current,0x3a);
      if (lVar4 == -1) {
        ::std::__cxx11::string::substr((ulong)local_48,(ulong)current);
        ::std::__cxx11::string::operator=((string *)name,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0]);
        }
        ::std::__cxx11::string::_M_replace((ulong)value,0,(char *)value->_M_string_length,0x1479ca);
      }
      else {
        ::std::__cxx11::string::substr((ulong)local_48,(ulong)current);
        ::std::__cxx11::string::operator=((string *)name,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0]);
        }
        ::std::__cxx11::string::substr((ulong)local_48,(ulong)current);
        ::std::__cxx11::string::operator=((string *)value,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0]);
        }
      }
      bVar3 = true;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_windows_style(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 1 && current[0] == '/' && valid_first_char(current[1])) {
        auto loc = current.find_first_of(':');
        if(loc != std::string::npos) {
            name = current.substr(1, loc - 1);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(1);
            value = "";
        }
        return true;
    }
    return false;
}